

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall Liby::TcpServer::handleAcceptEvent(TcpServer *this)

{
  uint __line;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  char *__assertion;
  __shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  ConnPtr connPtr;
  SockPtr sock;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ChanPtr local_40;
  
  if (this->listenfd_ < 0) {
    __assertion = "listenfd_ >= 0";
    __line = 0x23;
  }
  else {
    while( true ) {
      Socket::accept((Socket *)&sock,
                     (int)(this->socket_).
                          super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_RDX
                     ,(socklen_t *)in_RCX._M_pi);
      if (sock.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sock.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        return;
      }
      if (this->loop_ == (EventLoop *)0x0) break;
      local_68._M_unused._M_object =
           EventLoop::robinLoop
                     (this->loop_,
                      (sock.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      fd_);
      std::make_shared<Liby::Connection,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
                ((EventLoop **)
                 &connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>,
                 (shared_ptr<Liby::Socket> *)&local_68);
      initConnection(this,connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      peVar1 = connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68._M_unused._M_object =
           Connection::getPoller
                     (connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
      std::make_shared<Liby::Channel,Liby::Poller*,int>
                ((Poller **)&local_40,(int *)local_68._M_pod_data);
      Connection::setChannel(peVar1,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      peVar1 = connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&_Stack_a0,
                 &connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68._8_2_ = 0;
      local_68._10_2_ = 0;
      local_68._12_4_ = 0;
      local_68._M_unused._M_object = operator_new(0x18);
      in_RCX._M_pi = _Stack_a0._M_refcount._M_pi;
      _Stack_a0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_unused._0_8_)->
      _vptr__Sp_counted_base = (_func_int **)this;
      *(element_type **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_unused._0_8_)->_M_use_count =
           _Stack_a0._M_ptr;
      _Stack_a0._M_ptr = (element_type *)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_68._M_unused._0_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)in_RCX._M_pi;
      pcStack_50 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                 ::_M_manager;
      Connection::runEventHandler(peVar1,(BasicHandler *)&local_68);
      std::_Function_base::~_Function_base((_Function_base *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sock.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      in_RDX = extraout_RDX;
    }
    __assertion = "sock && loop_";
    __line = 0x2a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                ,__line,"void Liby::TcpServer::handleAcceptEvent()");
}

Assistant:

void TcpServer::handleAcceptEvent() {
    assert(listenfd_ >= 0);
    for (;;) {
        try {
            auto sock = socket_->accept();
            if (!sock) {
                return;
            }
            assert(sock && loop_);
            ConnPtr connPtr = std::make_shared<Connection>(
                loop_->robinLoop(sock->fd()), sock);
            initConnection(*connPtr);
            connPtr->setChannel(
                std::make_shared<Channel>(connPtr->getPoller(), sock->fd()));
            connPtr->runEventHandler([this, connPtr] {
                connPtr->init();
                connPtr->init1();
                connPtr->enableRead();
                if (acceptorCallback_) {
                    acceptorCallback_(*connPtr);
                }
            });
        } catch (const char *err) {
            debug("accept: %s", err);
            handleErroEvent();
        }
    }
}